

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::EnumDescriptorProto::ByteSize(EnumDescriptorProto *this)

{
  byte bVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Type *value;
  int i;
  int iVar6;
  EnumOptions *value_00;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar3 = (uint)bVar1;
  iVar6 = 0;
  iVar4 = 0;
  if (bVar1 != 0) {
    iVar4 = 0;
    if ((bVar1 & 1) != 0) {
      iVar4 = internal::WireFormatLite::StringSize(this->name_);
      iVar4 = iVar4 + 1;
      uVar3 = this->_has_bits_[0];
    }
    if ((uVar3 & 4) != 0) {
      value_00 = this->options_;
      if (value_00 == (EnumOptions *)0x0) {
        value_00 = *(EnumOptions **)(default_instance_ + 0x30);
      }
      iVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumOptions>
                        (value_00);
      iVar4 = iVar4 + iVar5 + 1;
    }
  }
  iVar5 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  for (; iVar6 < iVar5; iVar6 = iVar6 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                      (&(this->value_).super_RepeatedPtrFieldBase,iVar6);
    iVar5 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::EnumValueDescriptorProto>(value);
    iVar4 = iVar4 + iVar5;
    iVar5 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar6 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int EnumDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.EnumOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  total_size += 1 * this->value_size();
  for (int i = 0; i < this->value_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->value(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}